

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void dump_screen(FILE *dumpfp)

{
  nh_drawing_info *pnVar1;
  nh_bool *pnVar2;
  long lVar3;
  int iVar4;
  nh_symdef *pnVar5;
  long lVar6;
  nh_bool *pnVar7;
  char scrline [81];
  char local_88 [88];
  
  pnVar7 = &dbuf[0][0].invis;
  pnVar1 = nh_get_drawing_info();
  lVar6 = 0;
  do {
    if (lVar6 == 0x15) {
      return;
    }
    pnVar2 = pnVar7;
    for (lVar3 = 0; lVar3 != 0x50; lVar3 = lVar3 + 1) {
      local_88[lVar3] = pnVar1->bgelements[*(short *)(pnVar2 + -0xe)].ch;
      if ((long)*(short *)(pnVar2 + -0xc) != 0) {
        local_88[lVar3] = pnVar1->traps[(long)*(short *)(pnVar2 + -0xc) + -1].ch;
      }
      if ((long)*(short *)(pnVar2 + -10) != 0) {
        local_88[lVar3] = pnVar1->objects[(long)*(short *)(pnVar2 + -10) + -1].ch;
      }
      if (*pnVar2 == '\0') {
        iVar4 = (int)*(short *)(pnVar2 + -4);
        if (*(short *)(pnVar2 + -4) != 0) {
          if ((pnVar1->num_monsters < iVar4) && ((*(short *)(pnVar2 + -2) & 8) != 0)) {
            pnVar5 = pnVar1->warnings + (~pnVar1->num_monsters + iVar4);
          }
          else {
            pnVar5 = pnVar1->monsters + (long)iVar4 + -1;
          }
          goto LAB_0016a1da;
        }
      }
      else {
        pnVar5 = pnVar1->invis;
LAB_0016a1da:
        local_88[lVar3] = pnVar5->ch;
      }
      pnVar2 = pnVar2 + 0x18;
    }
    local_88[0x50] = 0;
    fprintf((FILE *)dumpfp,"%s\n",local_88);
    lVar6 = lVar6 + 1;
    pnVar7 = pnVar7 + 0x780;
  } while( true );
}

Assistant:

void dump_screen(FILE *dumpfp)
{
    int x, y;
    char scrline[COLNO+1];
    const struct nh_drawing_info *di = nh_get_drawing_info();
    const struct nh_dbuf_entry *dbe;
    
    for (y = 0; y < ROWNO; y++) {
	for (x = 0; x < COLNO; x++) {
	    dbe = &dbuf[y][x];
	    scrline[x] = di->bgelements[dbe->bg].ch;
	    if (dbe->trap)	scrline[x] = di->traps[dbe->trap-1].ch;
	    if (dbe->obj)	scrline[x] = di->objects[dbe->obj-1].ch;
	    if (dbe->invis)	scrline[x] = di->invis[0].ch;
	    else if (dbe->mon) {
		if (dbe->mon > di->num_monsters && (dbe->monflags & MON_WARNING))
		    scrline[x] = di->warnings[dbe->mon - 1 - di->num_monsters].ch;
		else
		    scrline[x] = di->monsters[dbe->mon-1].ch;
	    }
	}
	
	scrline[COLNO] = '\0';
	fprintf(dumpfp, "%s\n", scrline);
    }
}